

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

VectorXd __thiscall
ChebTools::ChebyshevExpansion::get_node_function_values(ChebyshevExpansion *this)

{
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar1;
  long in_RSI;
  VectorXd VVar2;
  MatrixXd *local_20 [2];
  
  if (*(long *)(in_RSI + 0x38) < 1) {
    local_20[0] = UMatrixLibrary::get((UMatrixLibrary *)u_matrix_library,*(long *)(in_RSI + 8) - 1);
    if ((local_20[0]->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
        m_cols != *(long *)(in_RSI + 8)) {
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Product.h"
                    ,0x62,
                    "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                   );
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)local_20);
    IVar1 = extraout_RDX_00;
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
               (DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)(in_RSI + 0x30));
    IVar1 = extraout_RDX;
  }
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar1;
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd ChebyshevExpansion::get_node_function_values() const{
        if (m_nodal_value_cache.size() > 0) {
            return m_nodal_value_cache;
        }
        else {
            std::size_t N = m_c.size() - 1;
            return u_matrix_library.get(N) * m_c;
        }
    }